

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaAccuracy.cpp
# Opt level: O1

IterateResult __thiscall glcts::GPUShader5FmaAccuracyTest::iterate(GPUShader5FmaAccuracyTest *this)

{
  TestContext **ppTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *poVar3;
  TestLog *pTVar4;
  GLuint i_1;
  char *description;
  qpTestResult testResult;
  long lVar5;
  float fVar6;
  float fVar7;
  vector<float,_std::allocator<float>_> relative_errors_for_float_pass;
  vector<float,_std::allocator<float>_> results_of_float_pass;
  vector<float,_std::allocator<float>_> relative_errors_for_fma_pass;
  vector<float,_std::allocator<float>_> results_of_fma_pass;
  string local_270;
  string local_250;
  float local_230;
  float local_22c;
  vector<float,_std::allocator<float>_> local_228;
  vector<float,_std::allocator<float>_> local_208;
  vector<float,_std::allocator<float>_> local_1e8;
  vector<float,_std::allocator<float>_> local_1c8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  initTest(this);
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (GLfloat *)0x0;
  local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (GLfloat *)0x0;
  local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&local_1c8,10);
  std::vector<float,_std::allocator<float>_>::resize(&local_208,10);
  executePass(this,this->m_program_object_id_for_fma_pass,
              local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start);
  executePass(this,this->m_program_object_id_for_float_pass,
              local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (GLfloat *)0x0;
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (GLfloat *)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&local_1e8,10);
  std::vector<float,_std::allocator<float>_>::resize(&local_228,10);
  lVar5 = 0;
  do {
    fVar6 = 2.71828 - local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5];
    fVar7 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar7 = fVar6;
    }
    local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = fVar7 / 2.71828;
    fVar6 = 2.71828 - local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5];
    fVar7 = -fVar6;
    if (-fVar6 <= fVar6) {
      fVar7 = fVar6;
    }
    local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar5] = fVar7 / 2.71828;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  local_22c = 0.0;
  lVar5 = 0;
  local_230 = 0.0;
  do {
    local_22c = local_22c +
                local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
    local_230 = local_230 +
                local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  if (local_22c <= local_230) {
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Routine fma has lower accuracy than a * b + c !",0x2f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    ppTVar1 = &(this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    pTVar4 = (*ppTVar1)->m_log;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Sum of relative error","")
    ;
    paVar2 = &local_250.field_2;
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,0x1b32ab9);
    tcu::LogSection::LogSection((LogSection *)local_1b0,&local_270,&local_250);
    tcu::TestLog::startSection(pTVar4,(char *)local_1b0._0_8_,local_190._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    local_1b0._0_8_ = (*ppTVar1)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"fma       ",10);
    std::ostream::_M_insert<double>((double)local_22c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    local_1b0._0_8_ = (*ppTVar1)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"a * b + c ",10);
    std::ostream::_M_insert<double>((double)local_230);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    tcu::TestLog::endSection((*ppTVar1)->m_log);
    pTVar4 = (*ppTVar1)->m_log;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Relative errors","");
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,0x1b32ab9);
    tcu::LogSection::LogSection((LogSection *)local_1b0,&local_270,&local_250);
    tcu::TestLog::startSection(pTVar4,(char *)local_1b0._0_8_,local_190._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    logArray(this,"fma",
             local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,10);
    logArray(this,"a * b + c",
             local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,10);
    tcu::TestLog::endSection((*ppTVar1)->m_log);
    pTVar4 = (*ppTVar1)->m_log;
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"Results","");
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,0x1b32ab9);
    tcu::LogSection::LogSection((LogSection *)local_1b0,&local_270,&local_250);
    tcu::TestLog::startSection(pTVar4,(char *)local_1b0._0_8_,local_190._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != local_180) {
      operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != &local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    logArray(this,"fma",
             local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,10);
    logArray(this,"a * b + c",
             local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,10);
    tcu::TestLog::endSection((*ppTVar1)->m_log);
    description = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GPUShader5FmaAccuracyTest::iterate()
{
	initTest();

	/* Storage space for result values */
	std::vector<glw::GLfloat> results_of_float_pass;
	std::vector<glw::GLfloat> results_of_fma_pass;

	results_of_fma_pass.resize(m_n_draw_call_executions);
	results_of_float_pass.resize(m_n_draw_call_executions);

	/* Execute fma pass */
	executePass(m_program_object_id_for_fma_pass, &results_of_fma_pass[0]);

	/* Execute float pass */
	executePass(m_program_object_id_for_float_pass, &results_of_float_pass[0]);

	/* Storage space for relative errors */
	std::vector<glw::GLfloat> relative_errors_for_float_pass;
	std::vector<glw::GLfloat> relative_errors_for_fma_pass;

	relative_errors_for_fma_pass.resize(m_n_draw_call_executions);
	relative_errors_for_float_pass.resize(m_n_draw_call_executions);

	/* Calculate relative errors */
	for (glw::GLuint i = 0; i < m_n_draw_call_executions; ++i)
	{
		calculateRelativeError(results_of_fma_pass[i], m_expected_result, relative_errors_for_fma_pass[i]);
		calculateRelativeError(results_of_float_pass[i], m_expected_result, relative_errors_for_float_pass[i]);
	}

	/* Sum relative errors */
	glw::GLfloat relative_error_sum_for_fma_pass   = 0.0f;
	glw::GLfloat relative_error_sum_for_float_pass = 0.0f;

	for (glw::GLuint i = 0; i < m_n_draw_call_executions; ++i)
	{
		relative_error_sum_for_fma_pass += relative_errors_for_fma_pass[i];
		relative_error_sum_for_float_pass += relative_errors_for_float_pass[i];
	}

	if (relative_error_sum_for_fma_pass <= relative_error_sum_for_float_pass)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Routine fma has lower accuracy than a * b + c !"
						   << tcu::TestLog::EndMessage;

		/* Log sum of relative errors */
		m_testCtx.getLog() << tcu::TestLog::Section("Sum of relative error", "");
		m_testCtx.getLog() << tcu::TestLog::Message << "fma       " << relative_error_sum_for_fma_pass
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "a * b + c " << relative_error_sum_for_float_pass
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		/* Log relative errors */
		m_testCtx.getLog() << tcu::TestLog::Section("Relative errors", "");
		logArray("fma", &relative_errors_for_fma_pass[0], m_n_draw_call_executions);
		logArray("a * b + c", &relative_errors_for_float_pass[0], m_n_draw_call_executions);
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		/* Log results */
		m_testCtx.getLog() << tcu::TestLog::Section("Results", "");
		logArray("fma", &results_of_fma_pass[0], m_n_draw_call_executions);
		logArray("a * b + c", &results_of_float_pass[0], m_n_draw_call_executions);
		m_testCtx.getLog() << tcu::TestLog::EndSection;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}